

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect_four.cpp
# Opt level: O2

void main_program(void)

{
  double dVar1;
  ConnectFourState root_state;
  ComputeOptions options;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  undefined1 auStack_c0 [12];
  Move move;
  undefined4 uStack_b0;
  int iStack_ac;
  ConnectFourState state;
  ConnectFourState local_60;
  
  ConnectFourState::ConnectFourState(&state,6,7);
  while( true ) {
    bVar2 = ConnectFourState::has_moves(&state);
    if (!bVar2) break;
    poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar3 = std::operator<<(poVar3,"State: ");
    ConnectFourState::print(&state,poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    move = -1;
    if (state.player_to_move == 1) {
      ConnectFourState::ConnectFourState(&local_60,&state);
      root_state.board.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ = iStack_ac;
      root_state.board.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = CONCAT31(uStack_b0._1_3_,1);
      root_state._8_8_ = 0xbff0000000000000;
      root_state.player_to_move = 8;
      root_state.num_rows = 100000;
      root_state.board.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._8_12_ = auStack_c0;
      root_state.board.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = move;
      root_state.last_col = uStack_b0;
      root_state.last_row = iStack_ac;
      options.max_time = -1.0;
      options.number_of_threads = 8;
      options.max_iterations = 100000;
      options._16_4_ = CONCAT31(uStack_b0._1_3_,1);
      options._20_4_ = iStack_ac;
      move = MCTS::compute_move<ConnectFourState>(root_state,options);
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::~vector(&local_60.board);
      ConnectFourState::do_move(&state,move);
    }
    else {
      std::operator<<((ostream *)&std::cout,"Input your move: ");
      move = -1;
      std::istream::operator>>((istream *)&std::cin,&move);
      ConnectFourState::do_move(&state,move);
    }
  }
  poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar3 = std::operator<<(poVar3,"Final state: ");
  ConnectFourState::print(&state,poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  dVar1 = ConnectFourState::get_result(&state,2);
  if ((dVar1 != 1.0) || (NAN(dVar1))) {
    dVar1 = ConnectFourState::get_result(&state,1);
    pcVar4 = "Player 2 wins!";
    if (dVar1 != 1.0) {
      pcVar4 = "Nobody wins!";
    }
    if (NAN(dVar1)) {
      pcVar4 = "Nobody wins!";
    }
  }
  else {
    pcVar4 = "Player 1 wins!";
  }
  poVar3 = std::operator<<((ostream *)&std::cout,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::~vector(&state.board);
  return;
}

Assistant:

void main_program()
{
	using namespace std;

	bool human_player = true;

	MCTS::ComputeOptions player1_options, player2_options;
	player1_options.max_iterations = 100000;
	player1_options.verbose = true;
	player2_options.max_iterations =  10000;
	player2_options.verbose = true;

	ConnectFourState state;
	while (state.has_moves()) {
		cout << endl << "State: " << state << endl;

		ConnectFourState::Move move = ConnectFourState::no_move;
		if (state.player_to_move == 1) {
			move = MCTS::compute_move(state, player1_options);
			state.do_move(move);
		}
		else {
			if (human_player) {
				while (true) {
					cout << "Input your move: ";
					move = ConnectFourState::no_move;
					cin >> move;
					try {
						state.do_move(move);
						break;
					}
					catch (std::exception& ) {
						cout << "Invalid move." << endl;
					}
				}
			}
			else {
				move = MCTS::compute_move(state, player2_options);
				state.do_move(move);
			}
		}
	}

	cout << endl << "Final state: " << state << endl;

	if (state.get_result(2) == 1.0) {
		cout << "Player 1 wins!" << endl;
	}
	else if (state.get_result(1) == 1.0) {
		cout << "Player 2 wins!" << endl;
	}
	else {
		cout << "Nobody wins!" << endl;
	}
}